

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.hxx
# Opt level: O1

void MPIABI_Get_count_cold_1(void)

{
  undefined4 *in_RDI;
  
  in_RDI[6] = *in_RDI;
  *(undefined8 *)(in_RDI + 7) = *(undefined8 *)(in_RDI + 1);
  return;
}

Assistant:

~WPI_const_StatusPtr() {
    const MPI_Status *mpi_status_ptr = (const MPI_Status *)wrapped_status_ptr;
    if (mpi_status_ptr != MPI_STATUS_IGNORE &&
        mpi_status_ptr != MPI_STATUSES_IGNORE) {
      const_cast<WPI_Status *>(wrapped_status_ptr)->MPI_SOURCE =
          mpi_status_ptr->MPI_SOURCE;
      const_cast<WPI_Status *>(wrapped_status_ptr)->MPI_TAG =
          mpi_status_ptr->MPI_TAG;
      const_cast<WPI_Status *>(wrapped_status_ptr)->MPI_ERROR =
          mpi_status_ptr->MPI_ERROR;
    }
  }